

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

_Bool is_trapped_chest(object *obj)

{
  _Bool _Var1;
  object *obj_local;
  
  _Var1 = tval_is_chest(obj);
  if (_Var1) {
    if (obj->pval < 1) {
      obj_local._7_1_ = false;
    }
    else {
      obj_local._7_1_ = obj->pval != 1;
    }
  }
  else {
    obj_local._7_1_ = false;
  }
  return obj_local._7_1_;
}

Assistant:

bool is_trapped_chest(const struct object *obj)
{
	if (!tval_is_chest(obj))
		return false;

	/* Disarmed or opened chests are not trapped */
	if (obj->pval <= 0)
		return false;

	/* Some chests simply don't have traps */
	return (obj->pval == 1) ? false : true;
}